

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O0

bool __thiscall
deqp::egl::Image::GLES2ImageApi::RenderReadPixelsRenderbuffer::invokeGLES2
          (RenderReadPixelsRenderbuffer *this,GLES2ImageApi *api,
          MovePtr<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_> *img,
          Texture2D *reference)

{
  Functions *gl_00;
  glBindFramebufferFunc p_Var1;
  glBindRenderbufferFunc p_Var2;
  Library *egl;
  glViewportFunc p_Var3;
  glReadPixelsFunc p_Var4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  deUint32 dVar12;
  GLenum GVar13;
  deBool dVar14;
  TextureFormat *pTVar15;
  int *piVar16;
  TestLog *this_00;
  IllegalRendererException *pIVar17;
  MessageBuilder *this_01;
  UniqueImage *this_02;
  EGLImage img_00;
  void *pvVar18;
  EVP_PKEY_CTX *src;
  PixelBufferAccess local_2e0;
  PixelBufferAccess local_2b8;
  MessageBuilder local_290;
  undefined1 local_110 [8];
  Surface refSurface;
  Surface screen;
  undefined1 local_d0 [8];
  Renderbuffer renderbuffer;
  Framebuffer framebuffer;
  TestLog *log;
  RGBA threshold8;
  tcu local_80 [16];
  Vector<int,_4> local_70;
  tcu local_60 [16];
  tcu local_50 [8];
  IVec4 threshold;
  IVec4 bitDepth;
  Functions *gl;
  Texture2D *reference_local;
  MovePtr<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_> *img_local;
  GLES2ImageApi *api_local;
  RenderReadPixelsRenderbuffer *this_local;
  
  gl_00 = api->m_gl;
  pTVar15 = tcu::TextureLevelPyramid::getFormat(&reference->super_TextureLevelPyramid);
  tcu::getTextureFormatMantissaBitDepth((tcu *)(threshold.m_data + 2),pTVar15);
  tcu::Vector<int,_4>::Vector(&local_70,1);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&stack0xffffffffffffff70,8);
  tcu::operator-(local_80,(Vector<int,_4> *)&stack0xffffffffffffff70,
                 (Vector<int,_4> *)(threshold.m_data + 2));
  tcu::operator<<(local_60,&local_70,(Vector<int,_4> *)local_80);
  tcu::operator*(local_50,2,(Vector<int,_4> *)local_60);
  piVar16 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_50,0);
  uVar6 = de::clamp<int>(*piVar16,0,0xff);
  piVar16 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_50,1);
  uVar7 = de::clamp<int>(*piVar16,0,0xff);
  piVar16 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_50,2);
  uVar8 = de::clamp<int>(*piVar16,0,0xff);
  piVar16 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_50,3);
  uVar9 = de::clamp<int>(*piVar16,0,0xff);
  tcu::RGBA::RGBA((RGBA *)((long)&log + 4),uVar6 & 0xff,uVar7 & 0xff,uVar8 & 0xff,uVar9 & 0xff);
  this_00 = glu::CallLogWrapper::getLog(&api->super_CallLogWrapper);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)&renderbuffer.super_ObjectWrapper.m_object,
             gl_00);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)2> *)local_d0,gl_00);
  iVar10 = tcu::Texture2D::getWidth(reference);
  iVar11 = tcu::Texture2D::getHeight(reference);
  tcu::Surface::Surface((Surface *)&refSurface.m_pixels.m_cap,iVar10,iVar11);
  iVar10 = tcu::Texture2D::getWidth(reference);
  iVar11 = tcu::Texture2D::getHeight(reference);
  tcu::Surface::Surface((Surface *)local_110,iVar10,iVar11);
  pTVar15 = tcu::TextureLevelPyramid::getFormat(&reference->super_TextureLevelPyramid);
  if ((pTVar15->order != DS) &&
     (pTVar15 = tcu::TextureLevelPyramid::getFormat(&reference->super_TextureLevelPyramid),
     pTVar15->order != D)) {
    pTVar15 = tcu::TextureLevelPyramid::getFormat(&reference->super_TextureLevelPyramid);
    if (pTVar15->order != S) {
      tcu::TestLog::operator<<(&local_290,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      this_01 = tcu::MessageBuilder::operator<<
                          (&local_290,(char (*) [42])"Reading with ReadPixels from renderbuffer");
      tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_290);
      do {
        p_Var1 = gl_00->bindFramebuffer;
        dVar12 = glu::ObjectWrapper::operator*
                           ((ObjectWrapper *)&renderbuffer.super_ObjectWrapper.m_object);
        (*p_Var1)(0x8d40,dVar12);
        GVar13 = (*gl_00->getError)();
        glu::checkError(GVar13,"bindFramebuffer(GL_FRAMEBUFFER, *framebuffer)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                        ,0x2ca);
        dVar14 = ::deGetFalse();
      } while (dVar14 != 0);
      do {
        p_Var2 = gl_00->bindRenderbuffer;
        dVar12 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_d0);
        (*p_Var2)(0x8d41,dVar12);
        GVar13 = (*gl_00->getError)();
        glu::checkError(GVar13,"bindRenderbuffer(GL_RENDERBUFFER, *renderbuffer)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                        ,0x2cb);
        dVar14 = ::deGetFalse();
      } while (dVar14 != 0);
      egl = (api->super_ImageApi).m_egl;
      this_02 = de::details::UniqueBase<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_>::
                operator*(&img->
                           super_UniqueBase<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_>
                         );
      img_00 = eglu::UniqueImage::operator*(this_02);
      imageTargetRenderbuffer(egl,gl_00,img_00);
      dVar12 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_d0);
      framebufferRenderbuffer(gl_00,0x8ce0,dVar12);
      do {
        p_Var3 = gl_00->viewport;
        iVar10 = tcu::Texture2D::getWidth(reference);
        iVar11 = tcu::Texture2D::getHeight(reference);
        (*p_Var3)(0,0,iVar10,iVar11);
        GVar13 = (*gl_00->getError)();
        glu::checkError(GVar13,"viewport(0, 0, reference.getWidth(), reference.getHeight())",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                        ,0x2cf);
        dVar14 = ::deGetFalse();
      } while (dVar14 != 0);
      p_Var4 = gl_00->readPixels;
      iVar10 = tcu::Surface::getWidth((Surface *)&refSurface.m_pixels.m_cap);
      iVar11 = tcu::Surface::getHeight((Surface *)&refSurface.m_pixels.m_cap);
      tcu::Surface::getAccess(&local_2b8,(Surface *)&refSurface.m_pixels.m_cap);
      pvVar18 = tcu::PixelBufferAccess::getDataPtr(&local_2b8);
      (*p_Var4)(0,0,iVar10,iVar11,0x1908,0x1401,pvVar18);
      do {
        (*gl_00->bindFramebuffer)(0x8d40,0);
        GVar13 = (*gl_00->getError)();
        glu::checkError(GVar13,"bindFramebuffer(GL_FRAMEBUFFER, 0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                        ,0x2d3);
        dVar14 = ::deGetFalse();
      } while (dVar14 != 0);
      do {
        (*gl_00->bindRenderbuffer)(0x8d41,0);
        GVar13 = (*gl_00->getError)();
        glu::checkError(GVar13,"bindRenderbuffer(GL_RENDERBUFFER, 0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                        ,0x2d4);
        dVar14 = ::deGetFalse();
      } while (dVar14 != 0);
      do {
        (*gl_00->finish)();
        GVar13 = (*gl_00->getError)();
        glu::checkError(GVar13,"finish()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                        ,0x2d5);
        dVar14 = ::deGetFalse();
      } while (dVar14 != 0);
      tcu::Surface::getAccess(&local_2e0,(Surface *)local_110);
      src = (EVP_PKEY_CTX *)
            tcu::TextureLevelPyramid::getLevel(&reference->super_TextureLevelPyramid,0);
      tcu::copy((EVP_PKEY_CTX *)&local_2e0,src);
      bVar5 = tcu::pixelThresholdCompare
                        (this_00,"Renderbuffer read","Result from reading renderbuffer",
                         (Surface *)local_110,(Surface *)&refSurface.m_pixels.m_cap,
                         (RGBA *)((long)&log + 4),COMPARE_LOG_RESULT);
      tcu::Surface::~Surface((Surface *)local_110);
      tcu::Surface::~Surface((Surface *)&refSurface.m_pixels.m_cap);
      glu::TypedObjectWrapper<(glu::ObjectType)2>::~TypedObjectWrapper
                ((TypedObjectWrapper<(glu::ObjectType)2> *)local_d0);
      glu::TypedObjectWrapper<(glu::ObjectType)3>::~TypedObjectWrapper
                ((TypedObjectWrapper<(glu::ObjectType)3> *)
                 &renderbuffer.super_ObjectWrapper.m_object);
      return bVar5;
    }
    pIVar17 = (IllegalRendererException *)__cxa_allocate_exception(8);
    *pIVar17 = (IllegalRendererException)0x0;
    IllegalRendererException::IllegalRendererException(pIVar17);
    __cxa_throw(pIVar17,&IllegalRendererException::typeinfo,
                IllegalRendererException::~IllegalRendererException);
  }
  pIVar17 = (IllegalRendererException *)__cxa_allocate_exception(8);
  *pIVar17 = (IllegalRendererException)0x0;
  IllegalRendererException::IllegalRendererException(pIVar17);
  __cxa_throw(pIVar17,&IllegalRendererException::typeinfo,
              IllegalRendererException::~IllegalRendererException);
}

Assistant:

bool GLES2ImageApi::RenderReadPixelsRenderbuffer::invokeGLES2 (GLES2ImageApi& api, MovePtr<UniqueImage>& img, tcu::Texture2D& reference) const
{
	const glw::Functions&	gl				= api.m_gl;
	const tcu::IVec4		bitDepth		= tcu::getTextureFormatMantissaBitDepth(reference.getFormat());
	const tcu::IVec4		threshold		(2 * (tcu::IVec4(1) << (tcu::IVec4(8) - bitDepth)));
	const tcu::RGBA			threshold8		((deUint8)(de::clamp(threshold[0], 0, 255)), (deUint8)(de::clamp(threshold[1], 0, 255)), (deUint8)(de::clamp(threshold[2], 0, 255)), (deUint8)(de::clamp(threshold[3], 0, 255)));
	tcu::TestLog&			log				= api.getLog();
	Framebuffer				framebuffer		(gl);
	Renderbuffer			renderbuffer	(gl);
	tcu::Surface			screen			(reference.getWidth(), reference.getHeight());
	tcu::Surface			refSurface		(reference.getWidth(), reference.getHeight());

	// Branch only taken in TryAll case
	if (reference.getFormat().order == tcu::TextureFormat::DS || reference.getFormat().order == tcu::TextureFormat::D)
		throw IllegalRendererException(); // Skip, GLES2 does not support ReadPixels for depth attachments
	if (reference.getFormat().order == tcu::TextureFormat::S)
		throw IllegalRendererException(); // Skip, GLES2 does not support ReadPixels for stencil attachments

	log << tcu::TestLog::Message << "Reading with ReadPixels from renderbuffer" << tcu::TestLog::EndMessage;

	GLU_CHECK_GLW_CALL(gl, bindFramebuffer(GL_FRAMEBUFFER, *framebuffer));
	GLU_CHECK_GLW_CALL(gl, bindRenderbuffer(GL_RENDERBUFFER, *renderbuffer));
	imageTargetRenderbuffer(api.m_egl, gl, **img);
	framebufferRenderbuffer(gl, GL_COLOR_ATTACHMENT0, *renderbuffer);

	GLU_CHECK_GLW_CALL(gl, viewport(0, 0, reference.getWidth(), reference.getHeight()));

	gl.readPixels(0, 0, screen.getWidth(), screen.getHeight(), GL_RGBA, GL_UNSIGNED_BYTE, screen.getAccess().getDataPtr());

	GLU_CHECK_GLW_CALL(gl, bindFramebuffer(GL_FRAMEBUFFER, 0));
	GLU_CHECK_GLW_CALL(gl, bindRenderbuffer(GL_RENDERBUFFER, 0));
	GLU_CHECK_GLW_CALL(gl, finish());

	tcu::copy(refSurface.getAccess(), reference.getLevel(0));

	return tcu::pixelThresholdCompare(log, "Renderbuffer read", "Result from reading renderbuffer", refSurface, screen, threshold8, tcu::COMPARE_LOG_RESULT);

}